

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int setup_traffic_protection(ptls_t *tls,ptls_cipher_suite_t *cs,int is_enc,char *secret_label)

{
  ptls_aead_context_t *ppVar1;
  anon_struct_144_2_4aec0f7d_for_traffic_protection *local_48;
  int ret;
  st_ptls_traffic_protection_t *ctx;
  char *secret_label_local;
  int is_enc_local;
  ptls_cipher_suite_t *cs_local;
  ptls_t *tls_local;
  
  if (is_enc == 0) {
    local_48 = &tls->traffic_protection;
  }
  else {
    local_48 = (anon_struct_144_2_4aec0f7d_for_traffic_protection *)&(tls->traffic_protection).enc;
  }
  if ((secret_label == (char *)0x0) ||
     (tls_local._4_4_ = derive_secret(tls->key_schedule,local_48,secret_label), tls_local._4_4_ == 0
     )) {
    if ((local_48->dec).aead != (ptls_aead_context_t *)0x0) {
      ptls_aead_free((local_48->dec).aead);
    }
    ppVar1 = ptls_aead_new(cs->aead,cs->hash,is_enc,local_48);
    (local_48->dec).aead = ppVar1;
    if (ppVar1 == (ptls_aead_context_t *)0x0) {
      tls_local._4_4_ = 0x201;
    }
    else {
      tls_local._4_4_ = 0;
    }
  }
  return tls_local._4_4_;
}

Assistant:

static int setup_traffic_protection(ptls_t *tls, ptls_cipher_suite_t *cs, int is_enc, const char *secret_label)
{
    struct st_ptls_traffic_protection_t *ctx = is_enc ? &tls->traffic_protection.enc : &tls->traffic_protection.dec;

    if (secret_label != NULL) {
        int ret;
        if ((ret = derive_secret(tls->key_schedule, ctx->secret, secret_label)) != 0)
            return ret;
    }

    if (ctx->aead != NULL)
        ptls_aead_free(ctx->aead);
    if ((ctx->aead = ptls_aead_new(cs->aead, cs->hash, is_enc, ctx->secret)) == NULL)
        return PTLS_ERROR_NO_MEMORY; /* TODO obtain error from ptls_aead_new */
    PTLS_DEBUGF("[%s] %02x%02x,%02x%02x\n", secret_label, (unsigned)ctx->secret[0], (unsigned)ctx->secret[1],
                (unsigned)ctx->aead->static_iv[0], (unsigned)ctx->aead->static_iv[1]);

    return 0;
}